

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

void __thiscall
Simulator::simulation
          (Simulator *this,MultipleShootingCGMRES *cgmres_solver,VectorXd *initial_state_vec,
          double start_time,double end_time,double sampling_period,string *savefile_name)

{
  NMPCModel *this_00;
  double time_param;
  ostream *poVar1;
  long lVar2;
  long lVar3;
  double current_time;
  double local_8f8;
  VectorXd next_state_vec;
  VectorXd current_state_vec;
  VectorXd control_input_vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_860 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_848 [24];
  ofstream conditions_data;
  ofstream error_data;
  ofstream control_input_data;
  ofstream state_data;
  
  this_00 = &this->model_;
  _state_data = NMPCModel::dimState(this_00);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&current_state_vec,(int *)&state_data);
  _state_data = NMPCModel::dimState(this_00);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&next_state_vec,(int *)&state_data);
  _state_data = NMPCModel::dimControlInput(this_00);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&control_input_vec,(int *)&state_data);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &control_input_data,savefile_name,"_state.dat");
  std::ofstream::ofstream(&state_data,(string *)&control_input_data,_S_out);
  std::__cxx11::string::~string((string *)&control_input_data);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error_data,
                 savefile_name,"_control_input.dat");
  std::ofstream::ofstream(&control_input_data,(string *)&error_data,_S_out);
  std::__cxx11::string::~string((string *)&error_data);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &conditions_data,savefile_name,"_error.dat");
  std::ofstream::ofstream(&error_data,(string *)&conditions_data,_S_out);
  std::__cxx11::string::~string((string *)&conditions_data);
  std::operator+(&local_880,savefile_name,"_conditions.dat");
  std::ofstream::ofstream(&conditions_data,(string *)&local_880,_S_out);
  std::__cxx11::string::~string((string *)&local_880);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&current_state_vec,initial_state_vec);
  poVar1 = std::operator<<((ostream *)&std::cout,"Start simulation");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_8f8 = 0.0;
  for (current_time = start_time; current_time < end_time;
      current_time = current_time + sampling_period) {
    time_param = MultipleShootingCGMRES::getError(cgmres_solver,current_time,&current_state_vec);
    saveData(this,&state_data,&control_input_data,&error_data,time_param,&current_state_vec,
             &control_input_vec,time_param);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_848,
               &next_state_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (type *)0x0);
    NumericalIntegrator::rungeKuttaGill
              ((NumericalIntegrator *)&this->field_0x40,current_time,&current_state_vec,
               &control_input_vec,sampling_period,
               (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_848);
    lVar2 = std::chrono::_V2::system_clock::now();
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_860,
               (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&control_input_vec,
               (type *)0x0);
    MultipleShootingCGMRES::controlUpdate
              (cgmres_solver,current_time,sampling_period,&current_state_vec,
               (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_860);
    poVar1 = std::operator<<((ostream *)&std::cout,"control_input_vec : ");
    poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &control_input_vec);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar3 = std::chrono::_V2::system_clock::now();
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&current_state_vec,&next_state_vec);
    local_8f8 = local_8f8 + (double)((lVar3 - lVar2) / 1000) * 1e-06;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"End simulation");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Total CPU time for control update: ");
  poVar1 = std::ostream::_M_insert<double>(local_8f8);
  poVar1 = std::operator<<(poVar1," [sec]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&conditions_data,"simulation name: ");
  poVar1 = std::operator<<(poVar1,(string *)savefile_name);
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&conditions_data,"simulation time: ");
  poVar1 = std::ostream::_M_insert<double>(end_time - start_time);
  std::operator<<(poVar1," [sec]\n");
  std::operator<<((ostream *)&conditions_data,"CPU time for control update (total): ");
  poVar1 = std::ostream::_M_insert<double>(local_8f8);
  std::operator<<(poVar1," [sec]\n");
  std::operator<<((ostream *)&conditions_data,"sampling time: ");
  poVar1 = std::ostream::_M_insert<double>(sampling_period);
  std::operator<<(poVar1," [sec]\n");
  std::operator<<((ostream *)&conditions_data,"CPU time for control update (1step): ");
  poVar1 = std::ostream::_M_insert<double>
                     (local_8f8 / (double)(int)((end_time - start_time) / sampling_period));
  std::operator<<(poVar1," [sec]\n");
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(&conditions_data);
  std::ofstream::~ofstream(&error_data);
  std::ofstream::~ofstream(&control_input_data);
  std::ofstream::~ofstream(&state_data);
  free(control_input_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(next_state_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(current_state_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return;
}

Assistant:

void Simulator::simulation(MultipleShootingCGMRES cgmres_solver, const Eigen::VectorXd& initial_state_vec, const double start_time, const double end_time, const double sampling_period, const std::string savefile_name)
{
    Eigen::VectorXd current_state_vec(model_.dimState()), next_state_vec(model_.dimState()), control_input_vec(model_.dimControlInput());
    std::chrono::system_clock::time_point start_clock, end_clock;

    std::ofstream state_data(savefile_name + "_state.dat");
    std::ofstream control_input_data(savefile_name + "_control_input.dat");
    std::ofstream error_data(savefile_name + "_error.dat");
    std::ofstream conditions_data(savefile_name + "_conditions.dat");

    double total_time = 0;
    current_state_vec = initial_state_vec;
    std::cout << "Start simulation" << std::endl;
    for(double current_time=start_time; current_time<end_time; current_time+= sampling_period){
        saveData(state_data, control_input_data, error_data, current_time, current_state_vec, control_input_vec, cgmres_solver.getError(current_time, current_state_vec));

        // Compute the next state vector using the 4th Runge-Kutta-Gill method.
        rungeKuttaGill(current_time, current_state_vec, control_input_vec, sampling_period, next_state_vec);

        // Update the solution and measure computational time.
        start_clock = std::chrono::system_clock::now();
        cgmres_solver.controlUpdate(current_time, sampling_period, current_state_vec, control_input_vec);
        std::cout << "control_input_vec : " << control_input_vec << std::endl;

        end_clock = std::chrono::system_clock::now();

        // Convert computational time to seconds.
        double step_time = std::chrono::duration_cast<std::chrono::microseconds>(end_clock-start_clock).count();
        step_time *= 1e-06;
        total_time += step_time;

        current_state_vec = next_state_vec;
    }
    std::cout << "End simulation" << std::endl;
    std::cout << "Total CPU time for control update: " << total_time << " [sec]" << std::endl;

    // Save simulation conditions.
    conditions_data << "simulation name: " << savefile_name << "\n";
    conditions_data << "simulation time: " << end_time-start_time << " [sec]\n";
    conditions_data << "CPU time for control update (total): " << total_time << " [sec]\n";
    conditions_data << "sampling time: " << sampling_period << " [sec]\n";
    conditions_data << "CPU time for control update (1step): " << total_time/((int)( (end_time-start_time)/(sampling_period))) << " [sec]\n";

    state_data.close();
    control_input_data.close();
    error_data.close();
    conditions_data.close();
}